

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-type.cpp
# Opt level: O0

void __thiscall
yactfr::StructureType::StructureType
          (StructureType *this,uint minAlign,MemberTypes *memberTypes,Up *attrs)

{
  uint align;
  unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> local_30;
  Up *local_28;
  Up *attrs_local;
  MemberTypes *memberTypes_local;
  StructureType *pSStack_10;
  uint minAlign_local;
  StructureType *this_local;
  
  local_28 = attrs;
  attrs_local = (Up *)memberTypes;
  memberTypes_local._4_4_ = minAlign;
  pSStack_10 = this;
  align = anon_unknown_35::realMinAlign(memberTypes);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::unique_ptr
            (&local_30,attrs);
  CompoundDataType::CompoundDataType
            (&this->super_CompoundDataType,_kindStruct,minAlign,align,&local_30);
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            (&local_30);
  (this->super_CompoundDataType).super_DataType._vptr_DataType =
       (_func_int **)&PTR__StructureType_007e61e8;
  std::
  vector<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>,_std::allocator<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>_>_>
  ::vector(&this->_memberTypes,
           (vector<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>,_std::allocator<std::unique_ptr<const_yactfr::StructureMemberType,_std::default_delete<const_yactfr::StructureMemberType>_>_>_>
            *)attrs_local);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_yactfr::StructureMemberType_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_yactfr::StructureMemberType_*>_>_>
  ::unordered_map(&this->_namesToMemberTypes);
  _initNamesToMemberTypes(this);
  return;
}

Assistant:

StructureType::StructureType(const unsigned int minAlign, StructureType::MemberTypes&& memberTypes,
                             MapItem::Up attrs) :
    CompoundDataType {_kindStruct, minAlign, realMinAlign(memberTypes), std::move(attrs)},
    _memberTypes {std::move(memberTypes)}
{
    this->_initNamesToMemberTypes();
}